

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee
          (FunctionBody *this,ProfileId profiledCallSiteId,FunctionBody *inlineeFuncBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  FunctionBody *pFVar5;
  FunctionCodeGenRuntimeData *this_00;
  
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1a3a,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pvVar4 = FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,CodeGenRuntimeData);
  if (pvVar4 == (void *)0x0) {
    this_00 = (FunctionCodeGenRuntimeData *)0x0;
  }
  else {
    for (this_00 = *(FunctionCodeGenRuntimeData **)((long)pvVar4 + (ulong)profiledCallSiteId * 8);
        this_00 != (FunctionCodeGenRuntimeData *)0x0; this_00 = (this_00->next).ptr) {
      pFVar5 = FunctionCodeGenRuntimeData::GetFunctionBody(this_00);
      if (pFVar5 == inlineeFuncBody) {
        return this_00;
      }
    }
  }
  return this_00;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee(const ProfileId profiledCallSiteId, Js::FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        auto codeGenRuntimeData = this->GetCodeGenRuntimeDataWithLock();
        if (!codeGenRuntimeData)
        {
            return nullptr;
        }
        const FunctionCodeGenRuntimeData *runtimeData = codeGenRuntimeData[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->GetNext();
        }
        return runtimeData;
    }